

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_perform_search(Curl_easy *data)

{
  CURLcode CVar1;
  
  if (((data->req).p.imap)->query == (char *)0x0) {
    Curl_failf(data,"Cannot SEARCH without a query string.");
    CVar1 = CURLE_URL_MALFORMAT;
  }
  else {
    CVar1 = imap_sendf(data,"SEARCH %s");
    if (CVar1 == CURLE_OK) {
      (data->conn->proto).imapc.state = IMAP_SEARCH;
    }
  }
  return CVar1;
}

Assistant:

static CURLcode imap_perform_search(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct IMAP *imap = data->req.p.imap;

  /* Check we have a query string */
  if(!imap->query) {
    failf(data, "Cannot SEARCH without a query string.");
    return CURLE_URL_MALFORMAT;
  }

  /* Send the SEARCH command */
  result = imap_sendf(data, "SEARCH %s", imap->query);

  if(!result)
    imap_state(data, IMAP_SEARCH);

  return result;
}